

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryAnimationsLoader.cpp
# Opt level: O1

bool __thiscall COLLADASaxFWL::LibraryAnimationsLoader::end__sampler(LibraryAnimationsLoader *this)

{
  AnimationCurve *animationCurve;
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  long *plVar4;
  undefined4 extraout_var;
  size_type *psVar5;
  UI_STRING *uis;
  UI *ui;
  String local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->mCurrentAnimationCurveRequiresTangents == false) {
    COLLADAFW::FloatOrDoubleArray::clear(&this->mCurrentAnimationCurve->mInTangentValues);
    COLLADAFW::FloatOrDoubleArray::clear(&this->mCurrentAnimationCurve->mOutTangentValues);
  }
  uVar2 = FilePartLoader::getObjectFlags((FilePartLoader *)this);
  uVar1 = 1;
  if ((uVar2 >> 10 & 1) != 0) {
    animationCurve = this->mCurrentAnimationCurve;
    if (animationCurve->mInterpolationType == INTERPOLATION_UNKNOWN) {
      animationCurve->mInterpolationType = INTERPOLATION_LINEAR;
    }
    ui = (UI *)(ulong)this->mVerboseValidate;
    iVar3 = COLLADAFW::validate(animationCurve,this->mVerboseValidate);
    if (iVar3 == 0) {
      iVar3 = IFilePartLoader::writer((IFilePartLoader *)this,ui,uis);
      uVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x78))
                        ((long *)CONCAT44(extraout_var,iVar3),this->mCurrentAnimationCurve);
      if (this->mCurrentAnimationCurve != (AnimationCurve *)0x0) {
        (*(this->mCurrentAnimationCurve->super_Animation).
          super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)395>.super_Object._vptr_Object[1])
                  ();
      }
    }
    else {
      std::operator+(&local_38,"Animation curve \"",
                     &(this->mCurrentAnimationCurve->super_Animation).mName);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_58.field_2._M_allocated_capacity = *psVar5;
        local_58.field_2._8_8_ = plVar4[3];
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      }
      else {
        local_58.field_2._M_allocated_capacity = *psVar5;
        local_58._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_58._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      IFilePartLoader::handleFWLError
                ((IFilePartLoader *)this,ERROR_DATA_NOT_VALID,&local_58,SEVERITY_ERROR_NONCRITICAL);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  this->mCurrentAnimationCurve = (AnimationCurve *)0x0;
  this->mCurrentAnimationInfo = (AnimationInfo *)0x0;
  this->mCurrentAnimationCurveRequiresTangents = true;
  return (bool)uVar1;
}

Assistant:

bool LibraryAnimationsLoader::end__sampler()
	{
		bool success = true;
		if ( !mCurrentAnimationCurveRequiresTangents )
		{
			mCurrentAnimationCurve->getInTangentValues().clear();
			mCurrentAnimationCurve->getOutTangentValues().clear();
		}
		if ( (getObjectFlags() & Loader::ANIMATION_FLAG) != 0 )
		{
			//assume linear interpolation if no interpolation is set
			if ( mCurrentAnimationCurve->getInterpolationType() == COLLADAFW::AnimationCurve::INTERPOLATION_UNKNOWN )
			{
				mCurrentAnimationCurve->setInterpolationType(COLLADAFW::AnimationCurve::INTERPOLATION_LINEAR );
			}

			if ( COLLADAFW::validate( mCurrentAnimationCurve, mVerboseValidate ) == 0)
			{
				success = writer()->writeAnimation(mCurrentAnimationCurve);
				FW_DELETE mCurrentAnimationCurve;
			}
			else
			{
                handleFWLError ( SaxFWLError::ERROR_DATA_NOT_VALID, "Animation curve \"" + mCurrentAnimationCurve->getName () + "\" not valid!" );
			}
		}
		mCurrentAnimationCurve = 0;
		mCurrentAnimationInfo = 0;
		mCurrentAnimationCurveRequiresTangents = true;
		return success;
	}